

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TilePool.cpp
# Opt level: O1

Tile * __thiscall
TilePool::accessTile(Tile *__return_storage_ptr__,TilePool *this,size_t sectorId,uint offset)

{
  source_loc loc;
  logger *this_00;
  string_view_t fmt;
  uint local_4c [9];
  size_t local_28;
  
  local_4c[0] = offset;
  local_28 = sectorId;
  this_00 = spdlog::default_logger_raw();
  local_4c[1] = 0;
  local_4c[2] = 0;
  local_4c[3] = 0;
  local_4c[4] = 0;
  local_4c[5] = 0;
  local_4c[6] = 0;
  loc.funcname = (char *)0x0;
  loc.filename = (char *)0x0;
  loc.line = 0;
  loc._12_4_ = 0;
  fmt.size_ = 0x29;
  fmt.data_ = "TilePool access sector {} with offset {}.";
  spdlog::logger::log_<unsigned_long&,unsigned_int&>(this_00,loc,debug,fmt,&local_28,local_4c);
  Chunk::accessTile(__return_storage_ptr__,
                    (Chunk *)(this->items_).
                             super__Vector_base<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>,_std::allocator<std::unique_ptr<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[local_28 >> 6]._M_t.
                             super___uniq_ptr_impl<TilePool::PoolItem,_std::default_delete<TilePool::PoolItem>_>
                    ,((uint)local_28 & 0x3f) * 0x10 + local_4c[0]);
  return __return_storage_ptr__;
}

Assistant:

Tile TilePool::accessTile(size_t sectorId, unsigned int offset) {
    /*spdlog::debug("TilePool access id {}.", id);
    PoolItem* item = items_[static_cast<size_t>((id - baseId_) / CHUNK_AREA)].get();
    assert(item->allocated.test(id % CHUNK_AREA));
    return item->chunk.accessTile(id % CHUNK_AREA);*/

    spdlog::debug("TilePool access sector {} with offset {}.", sectorId, offset);
    PoolItem* item = items_[sectorId / SECTORS_PER_CHUNK].get();
    assert(item->allocated.test(sectorId % SECTORS_PER_CHUNK) && offset < SECTOR_SIZE);
    return item->chunk.accessTile(sectorId % SECTORS_PER_CHUNK * SECTOR_SIZE + offset);
}